

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.h
# Opt level: O0

void __thiscall
FunctionData::FunctionData
          (FunctionData *this,Allocator *allocator,SynBase *source,ScopeData *scope,bool coroutine,
          bool accessor,bool isOperator,TypeFunction *type,TypeBase *contextType,SynIdentifier *name
          ,IntrusiveList<MatchData> generics,uint uniqueId)

{
  uint uVar1;
  bool isOperator_local;
  bool accessor_local;
  bool coroutine_local;
  ScopeData *scope_local;
  SynBase *source_local;
  Allocator *allocator_local;
  FunctionData *this_local;
  
  this->source = source;
  this->scope = scope;
  this->coroutine = coroutine;
  this->accessor = accessor;
  this->isOperator = isOperator;
  this->type = type;
  this->contextType = contextType;
  this->name = name;
  (this->generics).head = generics.head;
  (this->generics).tail = generics.tail;
  this->uniqueId = uniqueId;
  IntrusiveList<MatchData>::IntrusiveList(&this->aliases);
  SmallArray<ArgumentData,_4U>::SmallArray(&this->arguments,allocator);
  SmallArray<FunctionData_*,_8U>::SmallArray(&this->instances,allocator);
  IntrusiveList<VariableHandle>::IntrusiveList(&this->argumentVariables);
  IntrusiveList<UpvalueData>::IntrusiveList(&this->upvalues);
  SmallDenseMap<VariableData_*,_UpvalueData_*,_VariableDataHasher,_2U>::SmallDenseMap
            (&this->upvalueVariableMap,allocator);
  SmallDenseSet<InplaceStr,_InplaceStrHasher,_2U>::SmallDenseSet(&this->upvalueNameSet,allocator);
  IntrusiveList<CoroutineStateData>::IntrusiveList(&this->coroutineState);
  SmallDenseMap<VariableData_*,_CoroutineStateData_*,_VariableDataHasher,_2U>::SmallDenseMap
            (&this->coroutineStateVariableMap,allocator);
  SmallDenseSet<InplaceStr,_InplaceStrHasher,_2U>::SmallDenseSet
            (&this->coroutineStateNameSet,allocator);
  IntrusiveList<CloseUpvaluesData>::IntrusiveList(&this->closeUpvalues);
  this->importModule = (ModuleData *)0x0;
  this->isInternal = false;
  this->isHidden = false;
  this->attributes = 0;
  uVar1 = InplaceStr::hash(&name->name);
  this->nameHash = uVar1;
  this->functionIndex = 0xffffffff;
  this->isPrototype = false;
  this->implementation = (FunctionData *)0x0;
  this->proto = (FunctionData *)0x0;
  this->isGenericInstance = false;
  this->definition = (SynFunctionDefinition *)0x0;
  this->delayedDefinition = (Lexeme *)0x0;
  this->declaration = (ExprBase *)0x0;
  this->functionScope = (ScopeData *)0x0;
  this->argumentsSize = 0;
  this->stackSize = 0;
  this->contextArgument = (VariableData *)0x0;
  this->coroutineJumpOffset = (VariableData *)0x0;
  this->yieldCount = 0;
  this->hasExplicitReturn = false;
  this->vmFunction = (VmFunction *)0x0;
  this->nextTranslateRestoreBlock = 0;
  return;
}

Assistant:

FunctionData(Allocator *allocator, SynBase *source, ScopeData *scope, bool coroutine, bool accessor, bool isOperator, TypeFunction *type, TypeBase *contextType, SynIdentifier *name, IntrusiveList<MatchData> generics, unsigned uniqueId): source(source), scope(scope), coroutine(coroutine), accessor(accessor), isOperator(isOperator), type(type), contextType(contextType), name(name), generics(generics), uniqueId(uniqueId), arguments(allocator), instances(allocator), upvalueVariableMap(allocator), upvalueNameSet(allocator), coroutineStateVariableMap(allocator), coroutineStateNameSet(allocator)
	{
		importModule = 0;

		isInternal = false;

		isHidden = false;

		attributes = 0;

		nameHash = name->name.hash();

		functionIndex = ~0u;

		isPrototype = false;
		implementation = NULL;

		proto = NULL;
		isGenericInstance = false;

		definition = NULL;
		delayedDefinition = NULL;

		declaration = NULL;

		functionScope = NULL;
		argumentsSize = 0;
		stackSize = 0;

		contextArgument = NULL;

		coroutineJumpOffset = NULL;

		yieldCount = 0;

		hasExplicitReturn = false;

		vmFunction = NULL;

		nextTranslateRestoreBlock = 0;
	}